

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  long *plVar8;
  TimeInMillis ms;
  TimeInMillis ms_00;
  long lVar9;
  uint uVar10;
  long lVar11;
  undefined1 local_b8 [8];
  string kTestsuites;
  long local_88;
  undefined1 local_78 [8];
  string kIndent;
  string local_50;
  
  local_b8 = (undefined1  [8])&kTestsuites._M_string_length;
  kIndent.field_2._8_8_ = unit_test;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"testsuites","");
  local_78 = (undefined1  [8])&kIndent._M_string_length;
  std::__cxx11::string::_M_construct((ulong)local_78,'\x02');
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{\n",2);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"tests","");
  iVar5 = UnitTestImpl::reportable_test_count(*(UnitTestImpl **)(kIndent.field_2._8_8_ + 0x40));
  OutputJsonKey(stream,(string *)local_b8,&local_50,iVar5,(string *)local_78,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"failures","");
  iVar5 = UnitTestImpl::failed_test_count(*(UnitTestImpl **)(kIndent.field_2._8_8_ + 0x40));
  OutputJsonKey(stream,(string *)local_b8,&local_50,iVar5,(string *)local_78,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"disabled","");
  iVar5 = UnitTestImpl::reportable_disabled_test_count
                    (*(UnitTestImpl **)(kIndent.field_2._8_8_ + 0x40));
  OutputJsonKey(stream,(string *)local_b8,&local_50,iVar5,(string *)local_78,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"errors","");
  OutputJsonKey(stream,(string *)local_b8,&local_50,0,(string *)local_78,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"random_seed","");
    OutputJsonKey(stream,(string *)local_b8,&local_50,
                  *(int *)(*(long *)(kIndent.field_2._8_8_ + 0x40) + 0x21c),(string *)local_78,true)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"timestamp","");
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
            ((string *)((long)&kTestsuites.field_2 + 8),
             *(internal **)(*(long *)(kIndent.field_2._8_8_ + 0x40) + 0x228),ms);
  OutputJsonKey(stream,(string *)local_b8,&local_50,(string *)((long)&kTestsuites.field_2 + 8),
                (string *)local_78,true);
  if ((long *)kTestsuites.field_2._8_8_ != &stack0xffffffffffffff78) {
    operator_delete((void *)kTestsuites.field_2._8_8_,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"time","");
  FormatTimeInMillisAsDuration_abi_cxx11_
            ((string *)((long)&kTestsuites.field_2 + 8),
             *(internal **)(*(long *)(kIndent.field_2._8_8_ + 0x40) + 0x230),ms_00);
  OutputJsonKey(stream,(string *)local_b8,&local_50,(string *)((long)&kTestsuites.field_2 + 8),
                (string *)local_78,false);
  if ((long *)kTestsuites.field_2._8_8_ != &stack0xffffffffffffff78) {
    operator_delete((void *)kTestsuites.field_2._8_8_,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  TestPropertiesAsJson
            (&local_50,(TestResult *)(*(long *)(kIndent.field_2._8_8_ + 0x40) + 0x178),
             (string *)local_78);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,",\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"name","");
  kTestsuites.field_2._8_8_ = &stack0xffffffffffffff78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kTestsuites.field_2 + 8),"AllTests","");
  OutputJsonKey(stream,(string *)local_b8,&local_50,(string *)((long)&kTestsuites.field_2 + 8),
                (string *)local_78,true);
  if ((long *)kTestsuites.field_2._8_8_ != &stack0xffffffffffffff78) {
    operator_delete((void *)kTestsuites.field_2._8_8_,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_78,(long)kIndent._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)local_b8,(long)kTestsuites._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\": [\n",5);
  lVar9 = *(long *)(kIndent.field_2._8_8_ + 0x40);
  lVar7 = *(long *)(lVar9 + 0xb8);
  bVar3 = false;
  if (0 < (int)((ulong)(*(long *)(lVar9 + 0xc0) - lVar7) >> 3)) {
    lVar11 = 0;
    bVar3 = false;
    do {
      lVar7 = *(long *)(lVar7 + lVar11 * 8);
      plVar8 = *(long **)(lVar7 + 0x30);
      plVar2 = *(long **)(lVar7 + 0x38);
      if (plVar8 != plVar2) {
        iVar5 = 0;
        do {
          uVar10 = *(byte *)(*plVar8 + 0x83) ^ 1;
          if (*(char *)(*plVar8 + 0x82) == '\0') {
            uVar10 = 0;
          }
          iVar5 = iVar5 + uVar10;
          plVar8 = plVar8 + 1;
        } while (plVar8 != plVar2);
        if (iVar5 != 0) {
          bVar4 = true;
          if (bVar3) {
            std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
            lVar9 = *(long *)(kIndent.field_2._8_8_ + 0x40);
            bVar4 = bVar3;
          }
          bVar3 = bVar4;
          PrintJsonTestSuite(stream,*(TestSuite **)(*(long *)(lVar9 + 0xb8) + lVar11 * 8));
          lVar9 = *(long *)(kIndent.field_2._8_8_ + 0x40);
        }
      }
      lVar11 = lVar11 + 1;
      lVar7 = *(long *)(lVar9 + 0xb8);
    } while (lVar11 < (int)((ulong)(*(long *)(lVar9 + 0xc0) - lVar7) >> 3));
  }
  bVar4 = TestResult::Failed((TestResult *)(lVar9 + 0x178));
  if (bVar4) {
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
    }
    OutputJsonTestSuiteForTestResult
              (stream,(TestResult *)(*(long *)(kIndent.field_2._8_8_ + 0x40) + 0x178));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_78,(long)kIndent._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}\n",2);
  if (local_78 != (undefined1  [8])&kIndent._M_string_length) {
    operator_delete((void *)local_78,kIndent._M_string_length + 1);
  }
  if (local_b8 != (undefined1  [8])&kTestsuites._M_string_length) {
    operator_delete((void *)local_b8,kTestsuites._M_string_length + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG_GET(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    if (unit_test.GetTestSuite(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestSuite(stream, *unit_test.GetTestSuite(i));
    }
  }

  // If there was a test failure outside of one of the test suites (like in a
  // test environment) include that in the output.
  if (unit_test.ad_hoc_test_result().Failed()) {
    if (comma) {
      *stream << ",\n";
    }
    OutputJsonTestSuiteForTestResult(stream, unit_test.ad_hoc_test_result());
  }

  *stream << "\n"
          << kIndent << "]\n"
          << "}\n";
}